

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall parser::parser(parser *this,size_t ring_size)

{
  io_buf *piVar1;
  long lVar2;
  label_parser *plVar3;
  label_parser *plVar4;
  byte bVar5;
  
  bVar5 = 0;
  VW::object_pool<example,_example_initializer>::object_pool(&this->example_pool,ring_size,8);
  VW::ptr_queue<example>::ptr_queue(&this->ready_parsed_examples,ring_size);
  this->input = (io_buf *)0x0;
  *(undefined4 *)((long)&this->output + 7) = 0;
  this->output = (io_buf *)0x0;
  this->ring_size = ring_size;
  (this->output_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->output_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->output_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->output_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->output_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->begin_parsed_examples = 0;
  this->end_parsed_examples = 0;
  *(undefined8 *)((long)&this->end_parsed_examples + 5) = 0;
  std::condition_variable::condition_variable(&this->output_done);
  this->done = false;
  this->label_sock = 0;
  this->bound_sock = 0;
  this->max_fd = 0;
  this->audit = false;
  this->decision_service_json = false;
  (this->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar1 = (io_buf *)operator_new(0xa8);
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002cd080;
  (piVar1->space)._begin = (char *)0x0;
  (piVar1->space)._end = (char *)0x0;
  (piVar1->space).end_array = (char *)0x0;
  (piVar1->space).erase_count = 0;
  (piVar1->files)._begin = (int *)0x0;
  (piVar1->files)._end = (int *)0x0;
  (piVar1->files).end_array = (int *)0x0;
  (piVar1->files).erase_count = 0;
  (piVar1->currentname)._begin = (char *)0x0;
  (piVar1->currentname)._end = (char *)0x0;
  (piVar1->currentname).end_array = (char *)0x0;
  (piVar1->currentname).erase_count = 0;
  (piVar1->finalname)._begin = (char *)0x0;
  (piVar1->finalname)._end = (char *)0x0;
  (piVar1->finalname).end_array = (char *)0x0;
  (piVar1->finalname).erase_count = 0;
  v_array<char>::resize(&piVar1->space,0x10000);
  piVar1->count = 0;
  piVar1->current = 0;
  piVar1->head = (piVar1->space)._begin;
  piVar1->_verify_hash = false;
  piVar1->_hash = 0;
  this->input = piVar1;
  piVar1 = (io_buf *)operator_new(0xa8);
  piVar1->_vptr_io_buf = (_func_int **)&PTR_open_file_002cd080;
  (piVar1->space)._begin = (char *)0x0;
  (piVar1->space)._end = (char *)0x0;
  (piVar1->space).end_array = (char *)0x0;
  (piVar1->space).erase_count = 0;
  (piVar1->files)._begin = (int *)0x0;
  (piVar1->files)._end = (int *)0x0;
  (piVar1->files).end_array = (int *)0x0;
  (piVar1->files).erase_count = 0;
  (piVar1->currentname)._begin = (char *)0x0;
  (piVar1->currentname)._end = (char *)0x0;
  (piVar1->currentname).end_array = (char *)0x0;
  (piVar1->currentname).erase_count = 0;
  (piVar1->finalname)._begin = (char *)0x0;
  (piVar1->finalname)._end = (char *)0x0;
  (piVar1->finalname).end_array = (char *)0x0;
  (piVar1->finalname).erase_count = 0;
  v_array<char>::resize(&piVar1->space,0x10000);
  piVar1->count = 0;
  piVar1->current = 0;
  piVar1->head = (piVar1->space)._begin;
  piVar1->_verify_hash = false;
  piVar1->_hash = 0;
  this->output = piVar1;
  plVar3 = &simple_label;
  plVar4 = &this->lp;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar4->default_label = plVar3->default_label;
    plVar3 = (label_parser *)((long)plVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    plVar4 = (label_parser *)((long)plVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  (this->words).end_array = (substring *)0x0;
  (this->words).erase_count = 0;
  (this->words)._begin = (substring *)0x0;
  (this->words)._end = (substring *)0x0;
  (this->name)._begin = (substring *)0x0;
  (this->name)._end = (substring *)0x0;
  (this->name).end_array = (substring *)0x0;
  (this->name).erase_count = 0;
  (this->parse_name)._begin = (substring *)0x0;
  (this->parse_name)._end = (substring *)0x0;
  (this->parse_name).end_array = (substring *)0x0;
  (this->parse_name).erase_count = 0;
  (this->gram_mask)._begin = (unsigned_long *)0x0;
  (this->gram_mask)._end = (unsigned_long *)0x0;
  (this->gram_mask).end_array = (unsigned_long *)0x0;
  (this->gram_mask).erase_count = 0;
  (this->ids)._begin = (unsigned_long *)0x0;
  (this->ids)._end = (unsigned_long *)0x0;
  (this->ids).end_array = (unsigned_long *)0x0;
  (this->ids).erase_count = 0;
  (this->counts)._begin = (unsigned_long *)0x0;
  (this->counts)._end = (unsigned_long *)0x0;
  (this->counts).end_array = (unsigned_long *)0x0;
  (this->counts).erase_count = 0;
  return;
}

Assistant:

parser(size_t ring_size)
      : example_pool{ring_size}, ready_parsed_examples{ring_size}, ring_size{ring_size}
  {
    this->input = new io_buf{};
    this->output = new io_buf{};
    this->lp = simple_label;

    // Free parser must still be used for the following fields.
    this->words = v_init<substring>();
    this->name = v_init<substring>();
    this->parse_name = v_init<substring>();
    this->gram_mask = v_init<size_t>();
    this->ids = v_init<size_t>();
    this->counts = v_init<size_t>();
  }